

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O0

bool __thiscall lex_less<const_char_*>::operator()(lex_less<const_char_*> *this,char **x,char **y)

{
  char *__first1;
  char *pcVar1;
  char *__first2;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  char **y_local;
  char **x_local;
  lex_less<const_char_*> *this_local;
  
  __first1 = *x;
  pcVar1 = *x;
  sVar4 = strlen(*x);
  __first2 = *y;
  pcVar2 = *y;
  sVar5 = strlen(*y);
  bVar3 = std::lexicographical_compare<char_const*,char_const*>
                    (__first1,pcVar1 + sVar4,__first2,pcVar2 + sVar5);
  return bVar3;
}

Assistant:

bool operator()(const T &x, const T &y) const
  {
    return (std::lexicographical_compare(x, x + strlen(x), y, y + strlen(y)));
  }